

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdVerifyEcdsaAdaptor
              (void *handle,char *adaptor_signature,char *proof,char *adaptor,char *msg,char *pubkey
              )

{
  bool bVar1;
  CfdException *pCVar2;
  int iVar3;
  allocator local_14d;
  allocator local_14c;
  allocator local_14b;
  allocator local_14a;
  allocator local_149;
  undefined1 local_148 [32];
  string local_128;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  string local_90;
  string local_70;
  string local_50;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(adaptor_signature);
  if (bVar1) {
    local_148._0_8_ = "cfdcapi_key.cpp";
    local_148._8_4_ = 0x16c;
    local_148._16_8_ = "CfdVerifyEcdsaAdaptor";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_148,"adaptor_signature is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_148,"Failed to parameter. adaptor_signature is null or empty.",
               (allocator *)&local_128);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_148);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(proof);
  if (bVar1) {
    local_148._0_8_ = "cfdcapi_key.cpp";
    local_148._8_4_ = 0x172;
    local_148._16_8_ = "CfdVerifyEcdsaAdaptor";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_148,"proof is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_148,"Failed to parameter. proof is null or empty.",
               (allocator *)&local_128);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_148);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(adaptor);
  if (bVar1) {
    local_148._0_8_ = "cfdcapi_key.cpp";
    local_148._8_4_ = 0x178;
    local_148._16_8_ = "CfdVerifyEcdsaAdaptor";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_148,"adaptor is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_148,"Failed to parameter. adaptor is null or empty.",
               (allocator *)&local_128);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_148);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(msg);
  if (!bVar1) {
    bVar1 = cfd::capi::IsEmptyString(pubkey);
    if (!bVar1) {
      std::__cxx11::string::string((string *)local_148,adaptor_signature,&local_149);
      cfd::core::AdaptorSignature::AdaptorSignature
                ((AdaptorSignature *)&local_a8,(string *)local_148);
      std::__cxx11::string::string((string *)&local_128,proof,&local_14a);
      cfd::core::AdaptorProof::AdaptorProof((AdaptorProof *)&local_c0,&local_128);
      std::__cxx11::string::string((string *)&local_50,adaptor,&local_14b);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_d8,&local_50);
      std::__cxx11::string::string((string *)&local_70,msg,&local_14c);
      cfd::core::ByteData256::ByteData256((ByteData256 *)&local_f0,&local_70);
      std::__cxx11::string::string((string *)&local_90,pubkey,&local_14d);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_108,&local_90);
      bVar1 = cfd::core::AdaptorUtil::Verify
                        ((AdaptorSignature *)&local_a8,(AdaptorProof *)&local_c0,(Pubkey *)&local_d8
                         ,(ByteData256 *)&local_f0,(Pubkey *)&local_108);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_108);
      std::__cxx11::string::~string((string *)&local_90);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_f0);
      std::__cxx11::string::~string((string *)&local_70);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_d8);
      std::__cxx11::string::~string((string *)&local_50);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c0);
      std::__cxx11::string::~string((string *)&local_128);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
      std::__cxx11::string::~string((string *)local_148);
      iVar3 = 7;
      if (bVar1) {
        iVar3 = 0;
      }
      return iVar3;
    }
    local_148._0_8_ = "cfdcapi_key.cpp";
    local_148._8_4_ = 0x184;
    local_148._16_8_ = "CfdVerifyEcdsaAdaptor";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_148,"pubkey is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_148,"Failed to parameter. pubkey is null or empty.",
               (allocator *)&local_128);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_148);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_148._0_8_ = "cfdcapi_key.cpp";
  local_148._8_4_ = 0x17e;
  local_148._16_8_ = "CfdVerifyEcdsaAdaptor";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_148,"msg is null or empty.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_148,"Failed to parameter. msg is null or empty.",
             (allocator *)&local_128);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_148);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdVerifyEcdsaAdaptor(
    void* handle, const char* adaptor_signature, const char* proof,
    const char* adaptor, const char* msg, const char* pubkey) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(adaptor_signature)) {
      warn(CFD_LOG_SOURCE, "adaptor_signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor_signature is null or empty.");
    }
    if (IsEmptyString(proof)) {
      warn(CFD_LOG_SOURCE, "proof is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. proof is null or empty.");
    }
    if (IsEmptyString(adaptor)) {
      warn(CFD_LOG_SOURCE, "adaptor is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor is null or empty.");
    }
    if (IsEmptyString(msg)) {
      warn(CFD_LOG_SOURCE, "msg is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. msg is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }

    bool is_verify = AdaptorUtil::Verify(
        AdaptorSignature(adaptor_signature), AdaptorProof(proof),
        Pubkey(adaptor), ByteData256(msg), Pubkey(pubkey));
    if (!is_verify) {
      return CfdErrorCode::kCfdSignVerificationError;
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}